

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O0

ArgIface * __thiscall Args::Arg::findArgument(Arg *this,String *name)

{
  bool bVar1;
  ArgIface *in_RDI;
  undefined5 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  byte bVar2;
  undefined1 in_stack_ffffffffffffff9f;
  undefined6 in_stack_ffffffffffffffa8;
  byte bVar3;
  undefined1 in_stack_ffffffffffffffaf;
  byte bVar4;
  size_type in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd4;
  String *in_stack_ffffffffffffffd8;
  ArgIface *local_8;
  
  bVar1 = details::isArgument((String *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  bVar3 = 0;
  bVar2 = bVar3;
  if (bVar1) {
    String::substr(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
    bVar3 = operator==((String *)in_RDI,
                       (String *)
                       CONCAT17(in_stack_ffffffffffffff9f,
                                CONCAT16(in_stack_ffffffffffffff9e,
                                         CONCAT15(in_stack_ffffffffffffff9d,
                                                  in_stack_ffffffffffffff98))));
    bVar2 = bVar3;
    String::~String((String *)0x106db6);
  }
  local_8 = in_RDI;
  if ((bVar3 & 1) == 0) {
    bVar1 = details::isFlag((String *)
                            CONCAT17(in_stack_ffffffffffffffaf,
                                     CONCAT16(bVar2,in_stack_ffffffffffffffa8)));
    bVar4 = 0;
    bVar2 = false;
    if (bVar1) {
      String::substr(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      bVar4 = 1;
      bVar2 = operator==((String *)in_RDI,
                         (String *)
                         CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffff9d,
                                                                in_stack_ffffffffffffff98))));
    }
    if ((bVar4 & 1) != 0) {
      String::~String((String *)0x106e3d);
    }
    local_8 = in_RDI;
    if ((bVar2 & 1) == 0) {
      local_8 = (ArgIface *)0x0;
    }
  }
  return local_8;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name ) override
	{
		if( details::isArgument( name ) && name.substr( 2 ) == m_name )
			return this;
		else if( details::isFlag( name ) && name.substr( 1 ) == m_flag )
			return this;
		else
			return nullptr;
	}